

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O2

int Hop_ManCleanup(Hop_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pHVar3;
  int iVar4;
  int i;
  long lVar5;
  
  if (p->fRefCount != 0) {
    iVar1 = p->nObjs[4];
    iVar2 = p->nObjs[5];
    p_00 = Vec_PtrAlloc((int)p);
    for (lVar5 = 0; lVar5 < p->nTableSize; lVar5 = lVar5 + 1) {
      pHVar3 = p->pTable[lVar5];
      if ((pHVar3 != (Hop_Obj_t *)0x0) && (*(uint *)&pHVar3->field_0x20 < 0x40)) {
        Vec_PtrPush(p_00,pHVar3);
      }
    }
    i = 0;
    iVar4 = p_00->nSize;
    if (p_00->nSize < 1) {
      iVar4 = i;
    }
    for (; iVar4 != i; i = i + 1) {
      pHVar3 = (Hop_Obj_t *)Vec_PtrEntry(p_00,i);
      Hop_ObjDelete_rec(p,pHVar3);
    }
    Vec_PtrFree(p_00);
    return (iVar2 + iVar1) - (p->nObjs[4] + p->nObjs[5]);
  }
  __assert_fail("p->fRefCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopMan.c"
                ,0x7d,"int Hop_ManCleanup(Hop_Man_t *)");
}

Assistant:

int Hop_ManCleanup( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pNode;
    int i, nNodesOld;
    assert( p->fRefCount );
    nNodesOld = Hop_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Hop_ManForEachNode( p, pNode, i )
        if ( Hop_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, vObjs, pNode, i )
        Hop_ObjDelete_rec( p, pNode );
    Vec_PtrFree( vObjs );
    return nNodesOld - Hop_ManNodeNum(p);
}